

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* parse_comma_float_array_list
            (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *__return_storage_ptr__,char *s)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  float fVar4;
  int nconsumed;
  float v_1;
  float v;
  vector<float,_std::allocator<float>_> af;
  char vstr [20];
  int local_7c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_78;
  float local_70;
  float local_6c;
  void *local_68;
  iterator iStack_60;
  float *local_58;
  char local_48 [24];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = __return_storage_ptr__;
  pcVar2 = strtok(s,"[]");
  if (pcVar2 != (char *)0x0) {
    do {
      local_7c = 0;
      iVar1 = __isoc99_sscanf(pcVar2,"%19[^,]%n",local_48,&local_7c);
      if (iVar1 == 1) {
        lVar3 = (long)local_7c;
        local_68 = (void *)0x0;
        iStack_60._M_current = (float *)0x0;
        local_58 = (float *)0x0;
        fVar4 = vstr_to_float(local_48);
        local_6c = fVar4;
        if (iStack_60._M_current == local_58) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_68,iStack_60,&local_6c);
          goto LAB_00167861;
        }
        do {
          *iStack_60._M_current = fVar4;
          iStack_60._M_current = iStack_60._M_current + 1;
LAB_00167861:
          while( true ) {
            pcVar2 = pcVar2 + lVar3;
            iVar1 = __isoc99_sscanf(pcVar2,",%19[^,]%n",local_48,&local_7c);
            if (iVar1 != 1) {
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::push_back(local_78,(value_type *)&local_68);
              if (local_68 != (void *)0x0) {
                operator_delete(local_68);
              }
              goto LAB_001678c6;
            }
            lVar3 = (long)local_7c;
            fVar4 = vstr_to_float(local_48);
            local_70 = fVar4;
            if (iStack_60._M_current != local_58) break;
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_68,iStack_60,&local_70);
          }
        } while( true );
      }
LAB_001678c6:
      pcVar2 = strtok((char *)0x0,"[]");
    } while (pcVar2 != (char *)0x0);
  }
  return local_78;
}

Assistant:

static std::vector<std::vector<float> > parse_comma_float_array_list(char* s)
{
    std::vector<std::vector<float> > aaf;

    char* pch = strtok(s, "[]");
    while (pch != NULL)
    {
        // parse a,b,c
        char vstr[20];
        int nconsumed = 0;
        int nscan = sscanf(pch, "%19[^,]%n", vstr, &nconsumed);
        if (nscan == 1)
        {
            // ok we get array
            pch += nconsumed;

            std::vector<float> af;
            float v = vstr_to_float(vstr);
            af.push_back(v);

            nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            while (nscan == 1)
            {
                pch += nconsumed;

                float v = vstr_to_float(vstr);
                af.push_back(v);

                nscan = sscanf(pch, ",%19[^,]%n", vstr, &nconsumed);
            }

            // array end
            aaf.push_back(af);
        }

        pch = strtok(NULL, "[]");
    }

    return aaf;
}